

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wedge_utils_sse2.c
# Opt level: O0

int8_t av1_wedge_sign_from_residuals_sse2(int16_t *ds,uint8_t *m,int N,int64_t limit)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long in_RCX;
  int in_EDX;
  void *in_RSI;
  void *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qa_07;
  undefined8 extraout_XMM0_Qa_08;
  undefined8 extraout_XMM0_Qa_09;
  undefined8 extraout_XMM0_Qa_10;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined8 extraout_XMM0_Qb_07;
  undefined8 extraout_XMM0_Qb_08;
  undefined8 extraout_XMM0_Qb_09;
  undefined8 extraout_XMM0_Qb_10;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  int iVar18;
  __m128i v_p4567_d;
  __m128i v_p0123_d;
  __m128i v_p67_d;
  __m128i v_p45_d;
  __m128i v_p23_d;
  __m128i v_p01_d;
  __m128i v_p7_d;
  __m128i v_p6_d;
  __m128i v_p5_d;
  __m128i v_p4_d;
  __m128i v_p3_d;
  __m128i v_p2_d;
  __m128i v_p1_d;
  __m128i v_p0_d;
  __m128i v_m7_w;
  __m128i v_m6_w;
  __m128i v_m5_w;
  __m128i v_m4_w;
  __m128i v_m3_w;
  __m128i v_m2_w;
  __m128i v_m1_w;
  __m128i v_m0_w;
  __m128i v_d7_w;
  __m128i v_d6_w;
  __m128i v_d5_w;
  __m128i v_d4_w;
  __m128i v_d3_w;
  __m128i v_d2_w;
  __m128i v_d1_w;
  __m128i v_d0_w;
  __m128i v_m67_b;
  __m128i v_m45_b;
  __m128i v_m23_b;
  __m128i v_m01_b;
  __m128i v_acc_q;
  __m128i v_acc1_d;
  __m128i v_acc0_d;
  __m128i v_sign_d;
  int64_t acc;
  undefined4 local_5b8;
  undefined4 uStack_5b4;
  undefined4 uStack_5b0;
  undefined4 uStack_5ac;
  undefined4 local_5a8;
  undefined4 uStack_5a4;
  undefined4 uStack_5a0;
  undefined4 uStack_59c;
  undefined4 local_56c;
  undefined8 local_568;
  undefined8 local_560;
  undefined1 local_488;
  undefined1 uStack_487;
  undefined1 uStack_486;
  undefined1 uStack_485;
  undefined1 uStack_484;
  undefined1 uStack_483;
  undefined1 uStack_482;
  undefined1 uStack_481;
  undefined1 local_468;
  undefined1 uStack_467;
  undefined1 uStack_466;
  undefined1 uStack_465;
  undefined1 uStack_464;
  undefined1 uStack_463;
  undefined1 uStack_462;
  undefined1 uStack_461;
  undefined1 local_448;
  undefined1 uStack_447;
  undefined1 uStack_446;
  undefined1 uStack_445;
  undefined1 uStack_444;
  undefined1 uStack_443;
  undefined1 uStack_442;
  undefined1 uStack_441;
  undefined1 local_428;
  undefined1 uStack_427;
  undefined1 uStack_426;
  undefined1 uStack_425;
  undefined1 uStack_424;
  undefined1 uStack_423;
  undefined1 uStack_422;
  undefined1 uStack_421;
  undefined1 uStack_400;
  undefined1 uStack_3ff;
  undefined1 uStack_3fe;
  undefined1 uStack_3fd;
  undefined1 uStack_3fc;
  undefined1 uStack_3fb;
  undefined1 uStack_3fa;
  undefined1 uStack_3f9;
  undefined1 uStack_3e0;
  undefined1 uStack_3df;
  undefined1 uStack_3de;
  undefined1 uStack_3dd;
  undefined1 uStack_3dc;
  undefined1 uStack_3db;
  undefined1 uStack_3da;
  undefined1 uStack_3d9;
  undefined1 uStack_3c0;
  undefined1 uStack_3bf;
  undefined1 uStack_3be;
  undefined1 uStack_3bd;
  undefined1 uStack_3bc;
  undefined1 uStack_3bb;
  undefined1 uStack_3ba;
  undefined1 uStack_3b9;
  undefined1 uStack_3a0;
  undefined1 uStack_39f;
  undefined1 uStack_39e;
  undefined1 uStack_39d;
  undefined1 uStack_39c;
  undefined1 uStack_39b;
  undefined1 uStack_39a;
  undefined1 uStack_399;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined4 local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined1 local_a8;
  undefined1 uStack_a7;
  undefined1 uStack_a6;
  undefined1 uStack_a5;
  undefined1 uStack_a4;
  undefined1 uStack_a3;
  undefined1 uStack_a2;
  undefined1 uStack_a1;
  
  local_5a8 = 0;
  uStack_5a4 = 0;
  uStack_5a0 = 0;
  uStack_59c = 0;
  local_5b8 = 0;
  uStack_5b4 = 0;
  uStack_5b0 = 0;
  uStack_5ac = 0;
  local_56c = in_EDX;
  local_568 = in_RSI;
  local_560 = in_RDI;
  do {
    xx_load_128(local_568);
    xx_load_128((void *)((long)local_568 + 0x10));
    xx_load_128((void *)((long)local_568 + 0x20));
    xx_load_128((void *)((long)local_568 + 0x30));
    xx_load_128(local_560);
    xx_load_128((void *)((long)local_560 + 0x10));
    xx_load_128((void *)((long)local_560 + 0x20));
    xx_load_128((void *)((long)local_560 + 0x30));
    xx_load_128((void *)((long)local_560 + 0x40));
    xx_load_128((void *)((long)local_560 + 0x50));
    xx_load_128((void *)((long)local_560 + 0x60));
    xx_load_128((void *)((long)local_560 + 0x70));
    local_428 = (byte)extraout_XMM0_Qa;
    uStack_427 = (undefined1)((ulong)extraout_XMM0_Qa >> 8);
    uStack_426 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x10);
    uStack_425 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x18);
    uStack_424 = (byte)((ulong)extraout_XMM0_Qa >> 0x20);
    uStack_423 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x28);
    uStack_422 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x30);
    uStack_421 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x38);
    uStack_3a0 = (byte)extraout_XMM0_Qb;
    uStack_39f = (undefined1)((ulong)extraout_XMM0_Qb >> 8);
    uStack_39e = (undefined1)((ulong)extraout_XMM0_Qb >> 0x10);
    uStack_39d = (undefined1)((ulong)extraout_XMM0_Qb >> 0x18);
    uStack_39c = (byte)((ulong)extraout_XMM0_Qb >> 0x20);
    uStack_39b = (undefined1)((ulong)extraout_XMM0_Qb >> 0x28);
    uStack_39a = (undefined1)((ulong)extraout_XMM0_Qb >> 0x30);
    uStack_399 = (undefined1)((ulong)extraout_XMM0_Qb >> 0x38);
    local_448 = (byte)extraout_XMM0_Qa_00;
    uStack_447 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 8);
    uStack_446 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x10);
    uStack_445 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x18);
    uStack_444 = (byte)((ulong)extraout_XMM0_Qa_00 >> 0x20);
    uStack_443 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x28);
    uStack_442 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x30);
    uStack_441 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x38);
    uStack_3c0 = (byte)extraout_XMM0_Qb_00;
    uStack_3bf = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 8);
    uStack_3be = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x10);
    uStack_3bd = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x18);
    uStack_3bc = (byte)((ulong)extraout_XMM0_Qb_00 >> 0x20);
    uStack_3bb = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x28);
    uStack_3ba = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x30);
    uStack_3b9 = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x38);
    local_468 = (byte)extraout_XMM0_Qa_01;
    uStack_467 = (undefined1)((ulong)extraout_XMM0_Qa_01 >> 8);
    uStack_466 = (undefined1)((ulong)extraout_XMM0_Qa_01 >> 0x10);
    uStack_465 = (undefined1)((ulong)extraout_XMM0_Qa_01 >> 0x18);
    uStack_464 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x20);
    uStack_463 = (undefined1)((ulong)extraout_XMM0_Qa_01 >> 0x28);
    uStack_462 = (undefined1)((ulong)extraout_XMM0_Qa_01 >> 0x30);
    uStack_461 = (undefined1)((ulong)extraout_XMM0_Qa_01 >> 0x38);
    uStack_3e0 = (byte)extraout_XMM0_Qb_01;
    uStack_3df = (undefined1)((ulong)extraout_XMM0_Qb_01 >> 8);
    uStack_3de = (undefined1)((ulong)extraout_XMM0_Qb_01 >> 0x10);
    uStack_3dd = (undefined1)((ulong)extraout_XMM0_Qb_01 >> 0x18);
    uStack_3dc = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x20);
    uStack_3db = (undefined1)((ulong)extraout_XMM0_Qb_01 >> 0x28);
    uStack_3da = (undefined1)((ulong)extraout_XMM0_Qb_01 >> 0x30);
    uStack_3d9 = (undefined1)((ulong)extraout_XMM0_Qb_01 >> 0x38);
    local_488 = (byte)extraout_XMM0_Qa_02;
    uStack_487 = (undefined1)((ulong)extraout_XMM0_Qa_02 >> 8);
    uStack_486 = (undefined1)((ulong)extraout_XMM0_Qa_02 >> 0x10);
    uStack_485 = (undefined1)((ulong)extraout_XMM0_Qa_02 >> 0x18);
    uStack_484 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x20);
    uStack_483 = (undefined1)((ulong)extraout_XMM0_Qa_02 >> 0x28);
    uStack_482 = (undefined1)((ulong)extraout_XMM0_Qa_02 >> 0x30);
    uStack_481 = (undefined1)((ulong)extraout_XMM0_Qa_02 >> 0x38);
    uStack_400 = (byte)extraout_XMM0_Qb_02;
    uStack_3ff = (undefined1)((ulong)extraout_XMM0_Qb_02 >> 8);
    uStack_3fe = (undefined1)((ulong)extraout_XMM0_Qb_02 >> 0x10);
    uStack_3fd = (undefined1)((ulong)extraout_XMM0_Qb_02 >> 0x18);
    uStack_3fc = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x20);
    uStack_3fb = (undefined1)((ulong)extraout_XMM0_Qb_02 >> 0x28);
    uStack_3fa = (undefined1)((ulong)extraout_XMM0_Qb_02 >> 0x30);
    uStack_3f9 = (undefined1)((ulong)extraout_XMM0_Qb_02 >> 0x38);
    auVar9[1] = 0;
    auVar9[0] = local_428;
    auVar9[2] = uStack_427;
    auVar9[3] = 0;
    auVar9[4] = uStack_426;
    auVar9[5] = 0;
    auVar9[6] = uStack_425;
    auVar9[7] = 0;
    auVar9[9] = 0;
    auVar9[8] = uStack_424;
    auVar9[10] = uStack_423;
    auVar9[0xb] = 0;
    auVar9[0xc] = uStack_422;
    auVar9[0xd] = 0;
    auVar9[0xe] = uStack_421;
    auVar8._8_8_ = extraout_XMM0_Qb_03;
    auVar8._0_8_ = extraout_XMM0_Qa_03;
    auVar9[0xf] = 0;
    auVar9 = pmaddwd(auVar8,auVar9);
    auVar10[1] = 0;
    auVar10[0] = uStack_3a0;
    auVar10[2] = uStack_39f;
    auVar10[3] = 0;
    auVar10[4] = uStack_39e;
    auVar10[5] = 0;
    auVar10[6] = uStack_39d;
    auVar10[7] = 0;
    auVar10[9] = 0;
    auVar10[8] = uStack_39c;
    auVar10[10] = uStack_39b;
    auVar10[0xb] = 0;
    auVar10[0xc] = uStack_39a;
    auVar10[0xd] = 0;
    auVar10[0xe] = uStack_399;
    auVar7._8_8_ = extraout_XMM0_Qb_04;
    auVar7._0_8_ = extraout_XMM0_Qa_04;
    auVar10[0xf] = 0;
    auVar10 = pmaddwd(auVar7,auVar10);
    auVar11[1] = 0;
    auVar11[0] = local_448;
    auVar11[2] = uStack_447;
    auVar11[3] = 0;
    auVar11[4] = uStack_446;
    auVar11[5] = 0;
    auVar11[6] = uStack_445;
    auVar11[7] = 0;
    auVar11[9] = 0;
    auVar11[8] = uStack_444;
    auVar11[10] = uStack_443;
    auVar11[0xb] = 0;
    auVar11[0xc] = uStack_442;
    auVar11[0xd] = 0;
    auVar11[0xe] = uStack_441;
    auVar6._8_8_ = extraout_XMM0_Qb_05;
    auVar6._0_8_ = extraout_XMM0_Qa_05;
    auVar11[0xf] = 0;
    auVar11 = pmaddwd(auVar6,auVar11);
    auVar12[1] = 0;
    auVar12[0] = uStack_3c0;
    auVar12[2] = uStack_3bf;
    auVar12[3] = 0;
    auVar12[4] = uStack_3be;
    auVar12[5] = 0;
    auVar12[6] = uStack_3bd;
    auVar12[7] = 0;
    auVar12[9] = 0;
    auVar12[8] = uStack_3bc;
    auVar12[10] = uStack_3bb;
    auVar12[0xb] = 0;
    auVar12[0xc] = uStack_3ba;
    auVar12[0xd] = 0;
    auVar12[0xe] = uStack_3b9;
    auVar5._8_8_ = extraout_XMM0_Qb_06;
    auVar5._0_8_ = extraout_XMM0_Qa_06;
    auVar12[0xf] = 0;
    auVar12 = pmaddwd(auVar5,auVar12);
    auVar13[1] = 0;
    auVar13[0] = local_468;
    auVar13[2] = uStack_467;
    auVar13[3] = 0;
    auVar13[4] = uStack_466;
    auVar13[5] = 0;
    auVar13[6] = uStack_465;
    auVar13[7] = 0;
    auVar13[9] = 0;
    auVar13[8] = uStack_464;
    auVar13[10] = uStack_463;
    auVar13[0xb] = 0;
    auVar13[0xc] = uStack_462;
    auVar13[0xd] = 0;
    auVar13[0xe] = uStack_461;
    auVar4._8_8_ = extraout_XMM0_Qb_07;
    auVar4._0_8_ = extraout_XMM0_Qa_07;
    auVar13[0xf] = 0;
    auVar13 = pmaddwd(auVar4,auVar13);
    auVar14[1] = 0;
    auVar14[0] = uStack_3e0;
    auVar14[2] = uStack_3df;
    auVar14[3] = 0;
    auVar14[4] = uStack_3de;
    auVar14[5] = 0;
    auVar14[6] = uStack_3dd;
    auVar14[7] = 0;
    auVar14[9] = 0;
    auVar14[8] = uStack_3dc;
    auVar14[10] = uStack_3db;
    auVar14[0xb] = 0;
    auVar14[0xc] = uStack_3da;
    auVar14[0xd] = 0;
    auVar14[0xe] = uStack_3d9;
    auVar3._8_8_ = extraout_XMM0_Qb_08;
    auVar3._0_8_ = extraout_XMM0_Qa_08;
    auVar14[0xf] = 0;
    auVar14 = pmaddwd(auVar3,auVar14);
    auVar15[1] = 0;
    auVar15[0] = local_488;
    auVar15[2] = uStack_487;
    auVar15[3] = 0;
    auVar15[4] = uStack_486;
    auVar15[5] = 0;
    auVar15[6] = uStack_485;
    auVar15[7] = 0;
    auVar15[9] = 0;
    auVar15[8] = uStack_484;
    auVar15[10] = uStack_483;
    auVar15[0xb] = 0;
    auVar15[0xc] = uStack_482;
    auVar15[0xd] = 0;
    auVar15[0xe] = uStack_481;
    auVar2._8_8_ = extraout_XMM0_Qb_09;
    auVar2._0_8_ = extraout_XMM0_Qa_09;
    auVar15[0xf] = 0;
    auVar15 = pmaddwd(auVar2,auVar15);
    auVar16[1] = 0;
    auVar16[0] = uStack_400;
    auVar16[2] = uStack_3ff;
    auVar16[3] = 0;
    auVar16[4] = uStack_3fe;
    auVar16[5] = 0;
    auVar16[6] = uStack_3fd;
    auVar16[7] = 0;
    auVar16[9] = 0;
    auVar16[8] = uStack_3fc;
    auVar16[10] = uStack_3fb;
    auVar16[0xb] = 0;
    auVar16[0xc] = uStack_3fa;
    auVar16[0xd] = 0;
    auVar16[0xe] = uStack_3f9;
    auVar1._8_8_ = extraout_XMM0_Qb_10;
    auVar1._0_8_ = extraout_XMM0_Qa_10;
    auVar16[0xf] = 0;
    auVar16 = pmaddwd(auVar1,auVar16);
    local_118 = auVar9._0_4_;
    uStack_114 = auVar9._4_4_;
    uStack_110 = auVar9._8_4_;
    uStack_10c = auVar9._12_4_;
    local_128 = auVar10._0_4_;
    uStack_124 = auVar10._4_4_;
    uStack_120 = auVar10._8_4_;
    uStack_11c = auVar10._12_4_;
    local_138 = auVar11._0_4_;
    uStack_134 = auVar11._4_4_;
    uStack_130 = auVar11._8_4_;
    uStack_12c = auVar11._12_4_;
    local_148 = auVar12._0_4_;
    uStack_144 = auVar12._4_4_;
    uStack_140 = auVar12._8_4_;
    uStack_13c = auVar12._12_4_;
    local_158 = auVar13._0_4_;
    uStack_154 = auVar13._4_4_;
    uStack_150 = auVar13._8_4_;
    uStack_14c = auVar13._12_4_;
    local_168 = auVar14._0_4_;
    uStack_164 = auVar14._4_4_;
    uStack_160 = auVar14._8_4_;
    uStack_15c = auVar14._12_4_;
    local_178 = auVar15._0_4_;
    uStack_174 = auVar15._4_4_;
    uStack_170 = auVar15._8_4_;
    uStack_16c = auVar15._12_4_;
    local_188 = auVar16._0_4_;
    uStack_184 = auVar16._4_4_;
    uStack_180 = auVar16._8_4_;
    uStack_17c = auVar16._12_4_;
    local_5a8 = local_5a8 + local_118 + local_128 + local_138 + local_148;
    uStack_5a4 = uStack_5a4 + uStack_114 + uStack_124 + uStack_134 + uStack_144;
    uStack_5a0 = uStack_5a0 + uStack_110 + uStack_120 + uStack_130 + uStack_140;
    uStack_59c = uStack_59c + uStack_10c + uStack_11c + uStack_12c + uStack_13c;
    local_5b8 = local_5b8 + local_158 + local_168 + local_178 + local_188;
    uStack_5b4 = uStack_5b4 + uStack_154 + uStack_164 + uStack_174 + uStack_184;
    uStack_5b0 = uStack_5b0 + uStack_150 + uStack_160 + uStack_170 + uStack_180;
    uStack_5ac = uStack_5ac + uStack_14c + uStack_15c + uStack_16c + uStack_17c;
    local_560 = (void *)((long)local_560 + 0x80);
    local_568 = (void *)((long)local_568 + 0x40);
    local_56c = local_56c + -0x40;
  } while (local_56c != 0);
  iVar17 = -(uint)(local_5a8 < 0);
  iVar18 = -(uint)(uStack_5a4 < 0);
  local_a8 = (undefined1)iVar17;
  uStack_a7 = (undefined1)((uint)iVar17 >> 8);
  uStack_a6 = (undefined1)((uint)iVar17 >> 0x10);
  uStack_a5 = (undefined1)((uint)iVar17 >> 0x18);
  uStack_a4 = (undefined1)iVar18;
  uStack_a3 = (undefined1)((uint)iVar18 >> 8);
  uStack_a2 = (undefined1)((uint)iVar18 >> 0x10);
  uStack_a1 = (undefined1)((uint)iVar18 >> 0x18);
  return in_RCX < CONCAT17(uStack_a5,
                           CONCAT16(uStack_a6,CONCAT15(uStack_a7,CONCAT14(local_a8,local_5a8)))) +
                  CONCAT44(-(uint)(uStack_5a0 < 0),uStack_5a0) +
                  CONCAT44(-(uint)(local_5b8 < 0),local_5b8) +
                  CONCAT44(-(uint)(uStack_5b0 < 0),uStack_5b0) +
                  CONCAT17(uStack_a1,
                           CONCAT16(uStack_a2,CONCAT15(uStack_a3,CONCAT14(uStack_a4,uStack_5a4)))) +
                  CONCAT44(-(uint)(uStack_59c < 0),uStack_59c) +
                  CONCAT44(-(uint)(uStack_5b4 < 0),uStack_5b4) +
                  CONCAT44(-(uint)(uStack_5ac < 0),uStack_5ac);
}

Assistant:

int8_t av1_wedge_sign_from_residuals_sse2(const int16_t *ds, const uint8_t *m,
                                          int N, int64_t limit) {
  int64_t acc;

  __m128i v_sign_d;
  __m128i v_acc0_d = _mm_setzero_si128();
  __m128i v_acc1_d = _mm_setzero_si128();
  __m128i v_acc_q;

  // Input size limited to 8192 by the use of 32 bit accumulators and m
  // being between [0, 64]. Overflow might happen at larger sizes,
  // though it is practically impossible on real video input.
  assert(N < 8192);
  assert(N % 64 == 0);

  do {
    const __m128i v_m01_b = xx_load_128(m);
    const __m128i v_m23_b = xx_load_128(m + 16);
    const __m128i v_m45_b = xx_load_128(m + 32);
    const __m128i v_m67_b = xx_load_128(m + 48);

    const __m128i v_d0_w = xx_load_128(ds);
    const __m128i v_d1_w = xx_load_128(ds + 8);
    const __m128i v_d2_w = xx_load_128(ds + 16);
    const __m128i v_d3_w = xx_load_128(ds + 24);
    const __m128i v_d4_w = xx_load_128(ds + 32);
    const __m128i v_d5_w = xx_load_128(ds + 40);
    const __m128i v_d6_w = xx_load_128(ds + 48);
    const __m128i v_d7_w = xx_load_128(ds + 56);

    const __m128i v_m0_w = _mm_unpacklo_epi8(v_m01_b, _mm_setzero_si128());
    const __m128i v_m1_w = _mm_unpackhi_epi8(v_m01_b, _mm_setzero_si128());
    const __m128i v_m2_w = _mm_unpacklo_epi8(v_m23_b, _mm_setzero_si128());
    const __m128i v_m3_w = _mm_unpackhi_epi8(v_m23_b, _mm_setzero_si128());
    const __m128i v_m4_w = _mm_unpacklo_epi8(v_m45_b, _mm_setzero_si128());
    const __m128i v_m5_w = _mm_unpackhi_epi8(v_m45_b, _mm_setzero_si128());
    const __m128i v_m6_w = _mm_unpacklo_epi8(v_m67_b, _mm_setzero_si128());
    const __m128i v_m7_w = _mm_unpackhi_epi8(v_m67_b, _mm_setzero_si128());

    const __m128i v_p0_d = _mm_madd_epi16(v_d0_w, v_m0_w);
    const __m128i v_p1_d = _mm_madd_epi16(v_d1_w, v_m1_w);
    const __m128i v_p2_d = _mm_madd_epi16(v_d2_w, v_m2_w);
    const __m128i v_p3_d = _mm_madd_epi16(v_d3_w, v_m3_w);
    const __m128i v_p4_d = _mm_madd_epi16(v_d4_w, v_m4_w);
    const __m128i v_p5_d = _mm_madd_epi16(v_d5_w, v_m5_w);
    const __m128i v_p6_d = _mm_madd_epi16(v_d6_w, v_m6_w);
    const __m128i v_p7_d = _mm_madd_epi16(v_d7_w, v_m7_w);

    const __m128i v_p01_d = _mm_add_epi32(v_p0_d, v_p1_d);
    const __m128i v_p23_d = _mm_add_epi32(v_p2_d, v_p3_d);
    const __m128i v_p45_d = _mm_add_epi32(v_p4_d, v_p5_d);
    const __m128i v_p67_d = _mm_add_epi32(v_p6_d, v_p7_d);

    const __m128i v_p0123_d = _mm_add_epi32(v_p01_d, v_p23_d);
    const __m128i v_p4567_d = _mm_add_epi32(v_p45_d, v_p67_d);

    v_acc0_d = _mm_add_epi32(v_acc0_d, v_p0123_d);
    v_acc1_d = _mm_add_epi32(v_acc1_d, v_p4567_d);

    ds += 64;
    m += 64;

    N -= 64;
  } while (N);

  v_sign_d = _mm_cmplt_epi32(v_acc0_d, _mm_setzero_si128());
  v_acc0_d = _mm_add_epi64(_mm_unpacklo_epi32(v_acc0_d, v_sign_d),
                           _mm_unpackhi_epi32(v_acc0_d, v_sign_d));

  v_sign_d = _mm_cmplt_epi32(v_acc1_d, _mm_setzero_si128());
  v_acc1_d = _mm_add_epi64(_mm_unpacklo_epi32(v_acc1_d, v_sign_d),
                           _mm_unpackhi_epi32(v_acc1_d, v_sign_d));

  v_acc_q = _mm_add_epi64(v_acc0_d, v_acc1_d);

  v_acc_q = _mm_add_epi64(v_acc_q, _mm_srli_si128(v_acc_q, 8));

#if AOM_ARCH_X86_64
  acc = _mm_cvtsi128_si64(v_acc_q);
#else
  xx_storel_64(&acc, v_acc_q);
#endif

  return acc > limit;
}